

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O2

bool __thiscall
spirv_cross::CompilerMSL::emit_array_copy
          (CompilerMSL *this,char *expr,uint32_t lhs_id,uint32_t rhs_id,StorageClass lhs_storage,
          StorageClass rhs_storage)

{
  Variant *pVVar1;
  uint32_t id;
  bool bVar2;
  uint uVar3;
  SPIRVariable *pSVar4;
  SPIRType *pSVar5;
  SPIRVariable *pSVar6;
  CompilerError *this_00;
  byte bVar7;
  byte bVar8;
  byte bVar9;
  byte local_92;
  char *tag;
  StorageClass local_88;
  StorageClass local_84;
  uint32_t local_80;
  uint32_t local_7c;
  string local_78;
  string lhs;
  
  bVar8 = (byte)(0x1ca >> ((byte)lhs_storage & 0x1f)) & lhs_storage < StorageClassPushConstant;
  local_88 = rhs_storage;
  local_80 = lhs_id;
  local_7c = rhs_id;
  pSVar4 = Compiler::maybe_get_backing_variable((Compiler *)this,lhs_id);
  local_84 = lhs_storage;
  if ((((lhs_storage != StorageClassStorageBuffer || pSVar4 == (SPIRVariable *)0x0) ||
       (uVar3 = pSVar4->storage - StorageClassInput, 7 < uVar3)) ||
      (local_92 = 1, (0xe5U >> (uVar3 & 0x1f) & 1) == 0)) &&
     (local_92 = lhs_storage == StorageClassWorkgroup | bVar8,
     lhs_storage != StorageClassGeneric && pSVar4 != (SPIRVariable *)0x0)) {
    pSVar5 = Compiler::get<spirv_cross::SPIRType>
                       ((Compiler *)this,*(uint32_t *)&(pSVar4->super_IVariant).field_0xc);
    bVar2 = Compiler::type_is_block_like((Compiler *)this,pSVar5);
    local_92 = local_92 & !bVar2;
  }
  id = local_7c;
  bVar9 = rhs_storage < StorageClassPushConstant & (byte)(0x1ca >> ((byte)rhs_storage & 0x1f));
  pSVar6 = Compiler::maybe_get_backing_variable((Compiler *)this,local_7c);
  if ((((local_88 != StorageClassStorageBuffer || pSVar6 == (SPIRVariable *)0x0) ||
       (uVar3 = pSVar6->storage - StorageClassInput, 7 < uVar3)) ||
      (bVar7 = 1, (0xe5U >> (uVar3 & 0x1f) & 1) == 0)) &&
     (bVar7 = rhs_storage == StorageClassWorkgroup | bVar9,
     local_88 != StorageClassGeneric && pSVar6 != (SPIRVariable *)0x0)) {
    pSVar5 = Compiler::get<spirv_cross::SPIRType>
                       ((Compiler *)this,*(uint32_t *)&(pSVar6->super_IVariant).field_0xc);
    bVar2 = Compiler::type_is_block_like((Compiler *)this,pSVar5);
    bVar7 = bVar7 & !bVar2;
  }
  if ((((local_92 & bVar7) == 1) && ((this->msl_options).force_native_arrays == false)) &&
     ((this->is_using_builtin_array & 1U) == 0)) {
    bVar2 = false;
  }
  else {
    if (pSVar4 != (SPIRVariable *)0x0) {
      CompilerGLSL::flush_variable_declaration
                (&this->super_CompilerGLSL,(pSVar4->super_IVariant).self.id);
    }
    lhs._M_dataplus._M_p = (pointer)&lhs.field_2;
    lhs._M_string_length = 0;
    lhs.field_2._M_local_buf[0] = '\0';
    if (expr == (char *)0x0) {
      CompilerGLSL::to_expression_abi_cxx11_(&local_78,&this->super_CompilerGLSL,local_80,true);
      ::std::__cxx11::string::operator=((string *)&lhs,(string *)&local_78);
      ::std::__cxx11::string::~string((string *)&local_78);
    }
    else {
      ::std::__cxx11::string::assign((char *)&lhs);
    }
    pSVar5 = Compiler::expression_type((Compiler *)this,id);
    pSVar4 = Compiler::maybe_get_backing_variable((Compiler *)this,id);
    pVVar1 = (this->super_CompilerGLSL).super_Compiler.ir.ids.super_VectorView<spirv_cross::Variant>
             .ptr;
    if ((pVVar1[id].type == TypeConstant) ||
       ((((pSVar4 != (SPIRVariable *)0x0 && (pSVar4->remapped_variable == true)) &&
         (pSVar4->statically_assigned == true)) &&
        (pVVar1[(pSVar4->static_expression).id].type == TypeConstant)))) {
      bVar2 = false;
    }
    else {
      bVar2 = (local_88 & ~StorageClassUniform) != StorageClassUniformConstant;
    }
    add_spv_func_and_recompile
              (this,SPVFuncImplArrayCopyMultidim -
                    ((pSVar5->array).super_VectorView<unsigned_int>.buffer_size < 2));
    tag = (char *)0x0;
    bVar8 = bVar8 ^ 1;
    if (bVar2 || bVar8 != 0) {
      if (!bVar2 && local_84 == StorageClassWorkgroup) {
        tag = "FromConstantToThreadGroup";
      }
      else {
        bVar9 = bVar9 ^ 1;
        if (bVar8 == 0 && bVar9 == 0) {
          tag = "FromStackToStack";
        }
        else if (local_84 == StorageClassWorkgroup && bVar9 == 0) {
          tag = "FromStackToThreadGroup";
        }
        else if (local_88 == StorageClassWorkgroup && bVar8 == 0) {
          tag = "FromThreadGroupToStack";
        }
        else if ((local_84 ^ StorageClassWorkgroup) == StorageClassUniformConstant &&
                 (local_88 ^ StorageClassWorkgroup) == StorageClassUniformConstant) {
          tag = "FromThreadGroupToThreadGroup";
        }
        else if ((local_84 ^ StorageClassStorageBuffer) == StorageClassUniformConstant &&
                 (local_88 ^ StorageClassStorageBuffer) == StorageClassUniformConstant) {
          tag = "FromDeviceToDevice";
        }
        else if (!bVar2 && local_84 == StorageClassStorageBuffer) {
          tag = "FromConstantToDevice";
        }
        else if ((local_84 ^ StorageClassStorageBuffer) == StorageClassUniformConstant &&
                 (local_88 ^ StorageClassWorkgroup) == StorageClassUniformConstant) {
          tag = "FromThreadGroupToDevice";
        }
        else if (local_84 == StorageClassStorageBuffer && bVar9 == 0) {
          tag = "FromStackToDevice";
        }
        else if ((local_84 ^ StorageClassWorkgroup) == StorageClassUniformConstant &&
                 (local_88 ^ StorageClassStorageBuffer) == StorageClassUniformConstant) {
          tag = "FromDeviceToThreadGroup";
        }
        else {
          if (local_88 != StorageClassStorageBuffer || bVar8 != 0) {
            this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
            CompilerError::CompilerError(this_00,"Unknown storage class used for copying arrays.");
            __cxa_throw(this_00,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
          }
          tag = "FromDeviceToStack";
        }
      }
    }
    else {
      tag = "FromConstantToStack";
    }
    if (((local_92 & bVar7) != 0) && ((this->msl_options).force_native_arrays == false)) {
      CompilerGLSL::to_expression_abi_cxx11_(&local_78,&this->super_CompilerGLSL,id,true);
      CompilerGLSL::
      statement<char_const(&)[13],char_const*&,char_const(&)[2],std::__cxx11::string&,char_const(&)[12],std::__cxx11::string,char_const(&)[12]>
                (&this->super_CompilerGLSL,(char (*) [13])0x28b53a,&tag,(char (*) [2])0x29618e,&lhs,
                 (char (*) [12])".elements, ",&local_78,(char (*) [12])".elements);");
      ::std::__cxx11::string::~string((string *)&local_78);
    }
    if ((local_92 == 0) || ((this->msl_options).force_native_arrays != false)) {
      if ((bVar7 == 0) || ((this->msl_options).force_native_arrays != false)) {
        CompilerGLSL::to_expression_abi_cxx11_(&local_78,&this->super_CompilerGLSL,id,true);
        CompilerGLSL::
        statement<char_const(&)[13],char_const*&,char_const(&)[2],std::__cxx11::string&,char_const(&)[3],std::__cxx11::string,char_const(&)[3]>
                  (&this->super_CompilerGLSL,(char (*) [13])0x28b53a,&tag,(char (*) [2])0x29618e,
                   &lhs,(char (*) [3])0x294843,&local_78,(char (*) [3])0x27d6e8);
      }
      else {
        CompilerGLSL::to_expression_abi_cxx11_(&local_78,&this->super_CompilerGLSL,id,true);
        CompilerGLSL::
        statement<char_const(&)[13],char_const*&,char_const(&)[2],std::__cxx11::string&,char_const(&)[3],std::__cxx11::string,char_const(&)[12]>
                  (&this->super_CompilerGLSL,(char (*) [13])0x28b53a,&tag,(char (*) [2])0x29618e,
                   &lhs,(char (*) [3])0x294843,&local_78,(char (*) [12])".elements);");
      }
    }
    else {
      CompilerGLSL::to_expression_abi_cxx11_(&local_78,&this->super_CompilerGLSL,id,true);
      CompilerGLSL::
      statement<char_const(&)[13],char_const*&,char_const(&)[2],std::__cxx11::string&,char_const(&)[12],std::__cxx11::string,char_const(&)[3]>
                (&this->super_CompilerGLSL,(char (*) [13])0x28b53a,&tag,(char (*) [2])0x29618e,&lhs,
                 (char (*) [12])".elements, ",&local_78,(char (*) [3])0x27d6e8);
    }
    ::std::__cxx11::string::~string((string *)&local_78);
    ::std::__cxx11::string::~string((string *)&lhs);
    bVar2 = true;
  }
  return bVar2;
}

Assistant:

bool CompilerMSL::emit_array_copy(const char *expr, uint32_t lhs_id, uint32_t rhs_id,
								  StorageClass lhs_storage, StorageClass rhs_storage)
{
	// Allow Metal to use the array<T> template to make arrays a value type.
	// This, however, cannot be used for threadgroup address specifiers, so consider the custom array copy as fallback.
	bool lhs_is_thread_storage = storage_class_array_is_thread(lhs_storage);
	bool rhs_is_thread_storage = storage_class_array_is_thread(rhs_storage);

	bool lhs_is_array_template = lhs_is_thread_storage || lhs_storage == StorageClassWorkgroup;
	bool rhs_is_array_template = rhs_is_thread_storage || rhs_storage == StorageClassWorkgroup;

	// Special considerations for stage IO variables.
	// If the variable is actually backed by non-user visible device storage, we use array templates for those.
	//
	// Another special consideration is given to thread local variables which happen to have Offset decorations
	// applied to them. Block-like types do not use array templates, so we need to force POD path if we detect
	// these scenarios. This check isn't perfect since it would be technically possible to mix and match these things,
	// and for a fully correct solution we might have to track array template state through access chains as well,
	// but for all reasonable use cases, this should suffice.
	// This special case should also only apply to Function/Private storage classes.
	// We should not check backing variable for temporaries.
	auto *lhs_var = maybe_get_backing_variable(lhs_id);
	if (lhs_var && lhs_storage == StorageClassStorageBuffer && storage_class_array_is_thread(lhs_var->storage))
		lhs_is_array_template = true;
	else if (lhs_var && lhs_storage != StorageClassGeneric && type_is_block_like(get<SPIRType>(lhs_var->basetype)))
		lhs_is_array_template = false;

	auto *rhs_var = maybe_get_backing_variable(rhs_id);
	if (rhs_var && rhs_storage == StorageClassStorageBuffer && storage_class_array_is_thread(rhs_var->storage))
		rhs_is_array_template = true;
	else if (rhs_var && rhs_storage != StorageClassGeneric && type_is_block_like(get<SPIRType>(rhs_var->basetype)))
		rhs_is_array_template = false;

	// If threadgroup storage qualifiers are *not* used:
	// Avoid spvCopy* wrapper functions; Otherwise, spvUnsafeArray<> template cannot be used with that storage qualifier.
	if (lhs_is_array_template && rhs_is_array_template && !using_builtin_array())
	{
		// Fall back to normal copy path.
		return false;
	}
	else
	{
		// Ensure the LHS variable has been declared
		if (lhs_var)
			flush_variable_declaration(lhs_var->self);

		string lhs;
		if (expr)
			lhs = expr;
		else
			lhs = to_expression(lhs_id);

		// Assignment from an array initializer is fine.
		auto &type = expression_type(rhs_id);
		auto *var = maybe_get_backing_variable(rhs_id);

		// Unfortunately, we cannot template on address space in MSL,
		// so explicit address space redirection it is ...
		bool is_constant = false;
		if (ir.ids[rhs_id].get_type() == TypeConstant)
		{
			is_constant = true;
		}
		else if (var && var->remapped_variable && var->statically_assigned &&
		         ir.ids[var->static_expression].get_type() == TypeConstant)
		{
			is_constant = true;
		}
		else if (rhs_storage == StorageClassUniform || rhs_storage == StorageClassUniformConstant)
		{
			is_constant = true;
		}

		// For the case where we have OpLoad triggering an array copy,
		// we cannot easily detect this case ahead of time since it's
		// context dependent. We might have to force a recompile here
		// if this is the only use of array copies in our shader.
		add_spv_func_and_recompile(type.array.size() > 1 ? SPVFuncImplArrayCopyMultidim : SPVFuncImplArrayCopy);

		const char *tag = nullptr;
		if (lhs_is_thread_storage && is_constant)
			tag = "FromConstantToStack";
		else if (lhs_storage == StorageClassWorkgroup && is_constant)
			tag = "FromConstantToThreadGroup";
		else if (lhs_is_thread_storage && rhs_is_thread_storage)
			tag = "FromStackToStack";
		else if (lhs_storage == StorageClassWorkgroup && rhs_is_thread_storage)
			tag = "FromStackToThreadGroup";
		else if (lhs_is_thread_storage && rhs_storage == StorageClassWorkgroup)
			tag = "FromThreadGroupToStack";
		else if (lhs_storage == StorageClassWorkgroup && rhs_storage == StorageClassWorkgroup)
			tag = "FromThreadGroupToThreadGroup";
		else if (lhs_storage == StorageClassStorageBuffer && rhs_storage == StorageClassStorageBuffer)
			tag = "FromDeviceToDevice";
		else if (lhs_storage == StorageClassStorageBuffer && is_constant)
			tag = "FromConstantToDevice";
		else if (lhs_storage == StorageClassStorageBuffer && rhs_storage == StorageClassWorkgroup)
			tag = "FromThreadGroupToDevice";
		else if (lhs_storage == StorageClassStorageBuffer && rhs_is_thread_storage)
			tag = "FromStackToDevice";
		else if (lhs_storage == StorageClassWorkgroup && rhs_storage == StorageClassStorageBuffer)
			tag = "FromDeviceToThreadGroup";
		else if (lhs_is_thread_storage && rhs_storage == StorageClassStorageBuffer)
			tag = "FromDeviceToStack";
		else
			SPIRV_CROSS_THROW("Unknown storage class used for copying arrays.");

		// Pass internal array of spvUnsafeArray<> into wrapper functions
		if (lhs_is_array_template && rhs_is_array_template && !msl_options.force_native_arrays)
			statement("spvArrayCopy", tag, "(", lhs, ".elements, ", to_expression(rhs_id), ".elements);");
		if (lhs_is_array_template && !msl_options.force_native_arrays)
			statement("spvArrayCopy", tag, "(", lhs, ".elements, ", to_expression(rhs_id), ");");
		else if (rhs_is_array_template && !msl_options.force_native_arrays)
			statement("spvArrayCopy", tag, "(", lhs, ", ", to_expression(rhs_id), ".elements);");
		else
			statement("spvArrayCopy", tag, "(", lhs, ", ", to_expression(rhs_id), ");");
	}

	return true;
}